

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_RaiseMaster
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  bool bVar2;
  AActor *pAVar3;
  AActor *raiser;
  char *pcVar4;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003e822e;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e821e:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e822e:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11f6,
                  "int AF_AActor_A_RaiseMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  raiser = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (raiser == (AActor *)0x0) goto LAB_003e81bd;
    bVar2 = DObject::IsKindOf((DObject *)raiser,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e822e;
    }
  }
  else {
    if (raiser != (AActor *)0x0) goto LAB_003e821e;
LAB_003e81bd:
    raiser = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') {
LAB_003e81de:
      iVar1 = param[1].field_0.i;
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)&raiser->master);
      if (pAVar3 != (AActor *)0x0) {
        pAVar3 = GC::ReadBarrier<AActor>((AActor **)&raiser->master);
        if (iVar1 == 0) {
          raiser = (AActor *)0x0;
        }
        P_Thing_Raise(pAVar3,raiser);
      }
      return 0;
    }
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') goto LAB_003e81de;
    pcVar4 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x11f7,
                "int AF_AActor_A_RaiseMaster(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RaiseMaster)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(copy);

	if (self->master != NULL)
	{
		P_Thing_Raise(self->master, copy ? self : NULL);
	}
	return 0;
}